

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::testShader
               (NegativeTestContext *ctx,ImageOperation function,MemoryQualifier memory,
               TextureType imageType,TextureFormat *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Shader *pSVar2;
  ShaderType shaderType;
  size_type sVar3;
  RenderContext *renderCtx;
  undefined8 uVar4;
  _anonymous_namespace_ *p_Var5;
  _Alloc_hider _Var6;
  bool bVar7;
  deUint32 dVar8;
  long *plVar9;
  undefined8 *puVar10;
  char *__s;
  mapped_type *pmVar11;
  ulong uVar12;
  pointer pcVar13;
  size_t sVar14;
  undefined4 in_register_0000000c;
  ulong *puVar15;
  Shader **ppSVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  MemoryQualifier extraout_EDX;
  MemoryQualifier extraout_EDX_00;
  MemoryQualifier extraout_EDX_01;
  MemoryQualifier memory_00;
  ImageOperation extraout_EDX_02;
  ImageOperation extraout_EDX_03;
  ImageOperation extraout_EDX_04;
  ImageOperation function_00;
  TextureFormat *extraout_RDX;
  TextureFormat *extraout_RDX_00;
  TextureFormat *format_00;
  long lVar18;
  uint uVar19;
  long lVar20;
  undefined4 in_register_00000034;
  bool *pbVar21;
  Shader *pSVar22;
  undefined8 uVar23;
  char *pcVar24;
  string shaderSource;
  ostringstream declaration;
  ShaderProgram program;
  undefined1 local_378 [16];
  undefined1 local_368 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_362;
  byte local_349;
  _anonymous_namespace_ *local_348;
  NegativeTestContext *local_340;
  MemoryQualifier local_334;
  string local_330;
  TextureFormat *local_310;
  string local_308;
  undefined1 local_2e8 [8];
  _func_int **local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [6];
  ios_base local_278 [8];
  ios_base local_270 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_258;
  undefined1 local_238 [208];
  long local_168;
  ulong local_160;
  TestLog *local_158;
  ulong local_150;
  ulong local_148;
  string local_140;
  string local_120;
  undefined1 local_100 [16];
  Shader *local_f0;
  _Base_ptr p_Stack_e8;
  _Base_ptr local_e0;
  pointer local_d8;
  
  local_348 = (_anonymous_namespace_ *)CONCAT44(in_register_00000034,function);
  local_150 = CONCAT44(in_register_0000000c,imageType);
  local_158 = (ctx->super_CallLogWrapper).m_log;
  local_340 = ctx;
  local_334 = memory;
  local_310 = format;
  NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_(&local_308,local_348,memory)
  ;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_308);
  paVar17 = &local_330.field_2;
  puVar15 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_330.field_2._M_allocated_capacity = *puVar15;
    local_330.field_2._8_8_ = plVar9[3];
    local_330._M_dataplus._M_p = (pointer)paVar17;
  }
  else {
    local_330.field_2._M_allocated_capacity = *puVar15;
    local_330._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_330._M_string_length = plVar9[1];
  *plVar9 = (long)puVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)(ulong)local_334,
             (MemoryQualifier)local_330._M_string_length);
  uVar23 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar17) {
    uVar23 = local_330.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar23 < local_120._M_string_length + local_330._M_string_length) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar23 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_120._M_string_length + local_330._M_string_length) goto LAB_015e6dbd;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_120,0,(char *)0x0,(ulong)local_330._M_dataplus._M_p);
  }
  else {
LAB_015e6dbd:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_120._M_dataplus._M_p);
  }
  local_378._0_8_ = local_368;
  pcVar13 = (pointer)(puVar10 + 2);
  if ((pointer)*puVar10 == pcVar13) {
    uVar23 = *(undefined8 *)pcVar13;
    uVar4 = puVar10[3];
    local_368[0] = (undefined1)uVar23;
    local_368[1] = (undefined1)((ulong)uVar23 >> 8);
    local_368[2] = (undefined1)((ulong)uVar23 >> 0x10);
    local_368[3] = (undefined1)((ulong)uVar23 >> 0x18);
    local_368[4] = (undefined1)((ulong)uVar23 >> 0x20);
    local_368[5] = (undefined1)((ulong)uVar23 >> 0x28);
    aStack_362._M_allocated_capacity._0_2_ = (undefined2)((ulong)uVar23 >> 0x30);
    aStack_362._M_allocated_capacity._2_5_ = (undefined5)uVar4;
    aStack_362._M_local_buf[7] = (char)((ulong)uVar4 >> 0x28);
    aStack_362._8_2_ = (undefined2)((ulong)uVar4 >> 0x30);
  }
  else {
    uVar23 = *(undefined8 *)pcVar13;
    local_368[0] = (undefined1)uVar23;
    local_368[1] = (undefined1)((ulong)uVar23 >> 8);
    local_368[2] = (undefined1)((ulong)uVar23 >> 0x10);
    local_368[3] = (undefined1)((ulong)uVar23 >> 0x18);
    local_368[4] = (undefined1)((ulong)uVar23 >> 0x20);
    local_368[5] = (undefined1)((ulong)uVar23 >> 0x28);
    aStack_362._M_allocated_capacity._0_2_ = (undefined2)((ulong)uVar23 >> 0x30);
    local_378._0_8_ = (pointer)*puVar10;
  }
  local_378._8_8_ = puVar10[1];
  *puVar10 = pcVar13;
  puVar10[1] = 0;
  *pcVar13 = '\0';
  plVar9 = (long *)std::__cxx11::string::append(local_378);
  ppSVar16 = (Shader **)(plVar9 + 2);
  if ((Shader **)*plVar9 == ppSVar16) {
    local_f0 = *ppSVar16;
    p_Stack_e8 = (_Base_ptr)plVar9[3];
    local_100._0_8_ = &local_f0;
  }
  else {
    local_f0 = *ppSVar16;
    local_100._0_8_ = (Shader **)*plVar9;
  }
  local_100._8_8_ = plVar9[1];
  *plVar9 = (long)ppSVar16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)local_310,(TextureFormat *)local_100._8_8_);
  pSVar2 = (Shader *)((long)(ChannelOrder *)local_100._8_8_ + local_140._M_string_length);
  pSVar22 = (Shader *)0xf;
  if ((Shader **)local_100._0_8_ != &local_f0) {
    pSVar22 = local_f0;
  }
  if (pSVar22 < pSVar2) {
    uVar23 = (Shader *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar23 = local_140.field_2._M_allocated_capacity;
    }
    if (pSVar2 <= (ulong)uVar23) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,local_100._0_8_);
      goto LAB_015e6f0d;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append(local_100,(ulong)local_140._M_dataplus._M_p);
LAB_015e6f0d:
  local_2e8 = (undefined1  [8])local_2d8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar1) {
    sVar3 = paVar1->_M_allocated_capacity;
    uVar23 = puVar10[3];
    local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
    local_2d8[0]._M_allocated_capacity._1_5_ = (undefined5)(sVar3 >> 8);
    local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
    local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
    local_2d8[0]._8_2_ = (undefined2)uVar23;
    local_2d8[0]._10_4_ = (undefined4)((ulong)uVar23 >> 0x10);
    local_2d8[0]._14_2_ = (undefined2)((ulong)uVar23 >> 0x30);
  }
  else {
    sVar3 = paVar1->_M_allocated_capacity;
    local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
    local_2d8[0]._M_allocated_capacity._1_5_ = (undefined5)(sVar3 >> 8);
    local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
    local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
    local_2e8 = (undefined1  [8])*puVar10;
  }
  local_2e0 = (_func_int **)puVar10[1];
  *puVar10 = paVar1;
  puVar10[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  NegativeTestContext::beginSection(local_340,(string *)local_2e8);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,
                    CONCAT17(local_2d8[0]._M_local_buf[7],
                             CONCAT16(local_2d8[0]._M_local_buf[6],
                                      CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                               local_2d8[0]._M_local_buf[0]))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,(ulong)(local_140.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((Shader **)local_100._0_8_ != &local_f0) {
    operator_delete((void *)local_100._0_8_,(ulong)((long)&local_f0->m_gl + 1));
  }
  if ((undefined1 *)local_378._0_8_ != local_368) {
    operator_delete((void *)local_378._0_8_,
                    CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                             CONCAT15(local_368[5],
                                      CONCAT14(local_368[4],
                                               CONCAT13(local_368[3],
                                                        CONCAT12(local_368[2],
                                                                 CONCAT11(local_368[1],local_368[0])
                                                                ))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar17) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  uVar12 = local_150;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  local_349 = ~(0x9fU >> ((byte)uVar12 & 0x1f));
  local_160 = uVar12 & 0xffffffff;
  local_168 = local_160 * 4;
  lVar20 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar20];
    bVar7 = NegativeTestContext::isShaderSupported(local_340,shaderType);
    if (!bVar7) goto LAB_015e7f2b;
    local_100._0_8_ = &local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Verify shader: ","");
    glu::getShaderTypeName(shaderType);
    plVar9 = (long *)std::__cxx11::string::append((char *)local_100);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar17) {
      sVar3 = paVar17->_M_allocated_capacity;
      lVar18 = plVar9[3];
      local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
      local_2d8[0]._M_allocated_capacity._1_5_ = (undefined5)(sVar3 >> 8);
      local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
      local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
      local_2d8[0]._8_2_ = (undefined2)lVar18;
      local_2d8[0]._10_4_ = (undefined4)((ulong)lVar18 >> 0x10);
      local_2d8[0]._14_2_ = (undefined2)((ulong)lVar18 >> 0x30);
      local_2e8 = (undefined1  [8])local_2d8;
    }
    else {
      sVar3 = paVar17->_M_allocated_capacity;
      local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
      local_2d8[0]._M_allocated_capacity._1_5_ = (undefined5)(sVar3 >> 8);
      local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
      local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
      local_2e8 = (undefined1  [8])*plVar9;
    }
    local_2e0 = (_func_int **)plVar9[1];
    *plVar9 = (long)paVar17;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    NegativeTestContext::beginSection(local_340,(string *)local_2e8);
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    local_148 = (ulong)shaderType;
    if ((Shader **)local_100._0_8_ != &local_f0) {
      operator_delete((void *)local_100._0_8_,(ulong)((long)&local_f0->m_gl + 1));
    }
    local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
    local_f0 = (Shader *)0x0;
    p_Stack_e8 = (_Base_ptr)(local_100 + 8);
    local_d8 = (pointer)0x0;
    local_e0 = p_Stack_e8;
    __s = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    local_2e8 = (undefined1  [8])local_2d8;
    local_378._0_8_ = (pointer)0x11;
    local_2e8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)local_378);
    local_2d8[0]._M_local_buf[0] = (undefined1)local_378._0_8_;
    local_2d8[0]._M_allocated_capacity._1_5_ = SUB85(local_378._0_8_,1);
    local_2d8[0]._M_local_buf[6] = SUB81(local_378._0_8_,6);
    local_2d8[0]._M_local_buf[7] = SUB81(local_378._0_8_,7);
    *(undefined8 *)local_2e8 = 0x5245565f4c534c47;
    *(char *)((long)local_2e8 + 8) = 'S';
    *(char *)((long)local_2e8 + 9) = 'I';
    *(char *)((long)local_2e8 + 10) = 'O';
    *(char *)((long)local_2e8 + 0xb) = 'N';
    *(char *)((long)local_2e8 + 0xc) = '_';
    *(char *)((long)local_2e8 + 0xd) = 'D';
    *(char *)((long)local_2e8 + 0xe) = 'E';
    *(char *)((long)local_2e8 + 0xf) = 'C';
    *(char *)((long)local_2e8 + 0x10) = 'L';
    local_2e0 = (_func_int **)local_378._0_8_;
    *(char *)((long)local_2e8 + local_378._0_8_) = '\0';
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_2e8);
    pcVar24 = (char *)pmVar11->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar24,(ulong)__s);
    uVar12 = local_150;
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    uVar19 = (uint)uVar12;
    local_2e8 = (undefined1  [8])local_2d8;
    local_2e0 = (_func_int **)0x0;
    local_2d8[0]._M_local_buf[0] = '\0';
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368;
    if (uVar19 < 8 && (local_349 & 1) == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)local_2e8,0,(char *)0x0,
                 (ulong)(&DAT_01c79d08 + *(int *)(&DAT_01c79d08 + local_168)));
      local_368[2] = (undefined1)((uint5)local_2d8[0]._1_5_ >> 8);
      local_368[3] = (undefined1)((uint5)local_2d8[0]._1_5_ >> 0x10);
      local_368[4] = (undefined1)((uint5)local_2d8[0]._1_5_ >> 0x18);
      local_368[5] = (undefined1)((uint5)local_2d8[0]._1_5_ >> 0x20);
      if (local_2e8 == (undefined1  [8])local_2d8) {
        aStack_362._M_allocated_capacity._2_5_ =
             (undefined5)CONCAT42(local_2d8[0]._10_4_,local_2d8[0]._8_2_);
        aStack_362._M_local_buf[7] = (char)((uint)local_2d8[0]._10_4_ >> 0x18);
        aStack_362._8_2_ = local_2d8[0]._14_2_;
        local_378._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_368;
      }
      else {
        local_378._0_8_ = local_2e8;
      }
      aStack_362._M_local_buf[1] = local_2d8[0]._M_local_buf[7];
      aStack_362._M_local_buf[0] = local_2d8[0]._M_local_buf[6];
      local_368[1] = (undefined1)local_2d8[0]._M_allocated_capacity._1_5_;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_;
    }
    local_378._0_8_ = paVar17;
    local_2e8 = (undefined1  [8])local_2d8;
    local_308._M_dataplus._M_p = (pointer)0x13;
    local_378._8_8_ = local_2e0;
    local_368[0] = local_2d8[0]._M_local_buf[0];
    local_2e8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)&local_308);
    local_2d8[0]._M_local_buf[0] = SUB81(local_308._M_dataplus._M_p,0);
    local_2d8[0]._M_allocated_capacity._1_5_ = (undefined5)((ulong)local_308._M_dataplus._M_p >> 8);
    local_2d8[0]._M_local_buf[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
    local_2d8[0]._M_local_buf[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_2e8 = 0x5059545f4c534c47;
    *(char *)((long)local_2e8 + 8) = 'E';
    *(char *)((long)local_2e8 + 9) = '_';
    *(char *)((long)local_2e8 + 10) = 'E';
    *(char *)((long)local_2e8 + 0xb) = 'X';
    *(char *)((long)local_2e8 + 0xc) = 'T';
    *(char *)((long)local_2e8 + 0xd) = 'E';
    *(char *)((long)local_2e8 + 0xe) = 'N';
    *(char *)((long)local_2e8 + 0xf) = 'S';
    *(char *)((long)local_2e8 + 0xf) = 'S';
    *(char *)((long)local_2e8 + 0x10) = 'I';
    *(char *)((long)local_2e8 + 0x11) = 'O';
    *(char *)((long)local_2e8 + 0x12) = 'N';
    local_2e0 = (_func_int **)local_308._M_dataplus._M_p;
    *(char *)((long)local_2e8 + (long)local_308._M_dataplus._M_p) = '\0';
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_2e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_378);
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    if ((int)local_348 - 2U < 8) {
      local_2e8 = (undefined1  [8])local_2d8;
      local_378._0_8_ = (pointer)0x2e;
      local_2e8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)local_378);
      local_2d8[0]._M_local_buf[0] = (undefined1)local_378._0_8_;
      local_2d8[0]._M_allocated_capacity._1_5_ = SUB85(local_378._0_8_,1);
      local_2d8[0]._M_local_buf[6] = SUB81(local_378._0_8_,6);
      local_2d8[0]._M_local_buf[7] = SUB81(local_378._0_8_,7);
      *(char *)((long)local_2e8 + 0x1e) = '_';
      *(char *)((long)local_2e8 + 0x1f) = 'a';
      *(char *)((long)local_2e8 + 0x20) = 't';
      *(char *)((long)local_2e8 + 0x21) = 'o';
      *(char *)((long)local_2e8 + 0x22) = 'm';
      *(char *)((long)local_2e8 + 0x23) = 'i';
      *(char *)((long)local_2e8 + 0x24) = 'c';
      *(char *)((long)local_2e8 + 0x25) = ' ';
      *(char *)((long)local_2e8 + 0x26) = ':';
      *(char *)((long)local_2e8 + 0x27) = ' ';
      *(char *)((long)local_2e8 + 0x28) = 'e';
      *(char *)((long)local_2e8 + 0x29) = 'n';
      *(char *)((long)local_2e8 + 0x2a) = 'a';
      *(char *)((long)local_2e8 + 0x2b) = 'b';
      *(char *)((long)local_2e8 + 0x2c) = 'l';
      *(char *)((long)local_2e8 + 0x2d) = 'e';
      *(char *)((long)local_2e8 + 0x10) = 'S';
      *(char *)((long)local_2e8 + 0x11) = '_';
      *(char *)((long)local_2e8 + 0x12) = 's';
      *(char *)((long)local_2e8 + 0x13) = 'h';
      *(char *)((long)local_2e8 + 0x14) = 'a';
      *(char *)((long)local_2e8 + 0x15) = 'd';
      *(char *)((long)local_2e8 + 0x16) = 'e';
      *(char *)((long)local_2e8 + 0x17) = 'r';
      *(char *)((long)local_2e8 + 0x18) = '_';
      *(char *)((long)local_2e8 + 0x19) = 'i';
      *(char *)((long)local_2e8 + 0x1a) = 'm';
      *(char *)((long)local_2e8 + 0x1b) = 'a';
      *(char *)((long)local_2e8 + 0x1c) = 'g';
      *(char *)((long)local_2e8 + 0x1d) = 'e';
      *(char *)((long)local_2e8 + 0x1e) = '_';
      *(char *)((long)local_2e8 + 0x1f) = 'a';
      *(undefined8 *)local_2e8 = 0x69736e6574786523;
      *(char *)((long)local_2e8 + 8) = 'o';
      *(char *)((long)local_2e8 + 9) = 'n';
      *(char *)((long)local_2e8 + 10) = ' ';
      *(char *)((long)local_2e8 + 0xb) = 'G';
      *(char *)((long)local_2e8 + 0xc) = 'L';
      *(char *)((long)local_2e8 + 0xd) = '_';
      *(char *)((long)local_2e8 + 0xe) = 'O';
      *(char *)((long)local_2e8 + 0xf) = 'E';
      local_2e0 = (_func_int **)local_378._0_8_;
      *(char *)((long)local_2e8 + local_378._0_8_) = '\0';
    }
    else {
      local_2e8 = (undefined1  [8])local_2d8;
      local_2e0 = (_func_int **)0x0;
      local_2d8[0]._M_local_buf[0] = '\0';
    }
    local_308._M_dataplus._M_p = (pointer)0x17;
    local_378._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_368;
    local_378._0_8_ = std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_308);
    local_368[0] = SUB81(local_308._M_dataplus._M_p,0);
    local_368[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
    local_368[2] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x10);
    local_368[3] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x18);
    local_368[4] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x20);
    local_368[5] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x28);
    aStack_362._M_allocated_capacity._0_2_ = (undefined2)((ulong)local_308._M_dataplus._M_p >> 0x30)
    ;
    *(undefined8 *)local_378._0_8_ = 0x4e55465f4c534c47;
    *(char *)(local_378._0_8_ + 8) = 'C';
    *(char *)(local_378._0_8_ + 9) = 'T';
    *(char *)(local_378._0_8_ + 10) = 'I';
    *(char *)(local_378._0_8_ + 0xb) = 'O';
    *(char *)(local_378._0_8_ + 0xc) = 'N';
    *(char *)(local_378._0_8_ + 0xd) = '_';
    *(char *)(local_378._0_8_ + 0xe) = 'E';
    *(char *)(local_378._0_8_ + 0xf) = 'X';
    *(char *)(local_378._0_8_ + 0xf) = 'X';
    *(char *)(local_378._0_8_ + 0x10) = 'T';
    *(char *)(local_378._0_8_ + 0x11) = 'E';
    *(char *)(local_378._0_8_ + 0x12) = 'N';
    *(char *)(local_378._0_8_ + 0x13) = 'S';
    *(char *)(local_378._0_8_ + 0x14) = 'I';
    *(char *)(local_378._0_8_ + 0x15) = 'O';
    *(char *)(local_378._0_8_ + 0x16) = 'N';
    local_378._8_8_ = local_308._M_dataplus._M_p;
    *(char *)(local_378._0_8_ + (long)local_308._M_dataplus._M_p) = '\0';
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
    uVar12 = local_148;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    dVar8 = glu::getGLShaderType((ShaderType)uVar12);
    pcVar24 = "";
    if (dVar8 == 0x8dd9) {
      pcVar24 = "layout(max_vertices = 3) out;";
    }
    local_2e8 = (undefined1  [8])local_2d8;
    local_378._0_8_ = &DAT_00000016;
    local_2e8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)local_378);
    local_2d8[0]._M_local_buf[0] = (undefined1)local_378._0_8_;
    local_2d8[0]._M_allocated_capacity._1_5_ = SUB85(local_378._0_8_,1);
    local_2d8[0]._M_local_buf[6] = SUB81(local_378._0_8_,6);
    local_2d8[0]._M_local_buf[7] = SUB81(local_378._0_8_,7);
    *(undefined8 *)local_2e8 = 0x595254454d4f4547;
    *(char *)((long)local_2e8 + 8) = '_';
    *(char *)((long)local_2e8 + 9) = 'S';
    *(char *)((long)local_2e8 + 10) = 'H';
    *(char *)((long)local_2e8 + 0xb) = 'A';
    *(char *)((long)local_2e8 + 0xc) = 'D';
    *(char *)((long)local_2e8 + 0xd) = 'E';
    *(char *)((long)local_2e8 + 0xe) = 'R';
    *(char *)((long)local_2e8 + 0xf) = '_';
    *(char *)((long)local_2e8 + 0xe) = 'R';
    *(char *)((long)local_2e8 + 0xf) = '_';
    *(char *)((long)local_2e8 + 0x10) = 'L';
    *(char *)((long)local_2e8 + 0x11) = 'A';
    *(char *)((long)local_2e8 + 0x12) = 'Y';
    *(char *)((long)local_2e8 + 0x13) = 'O';
    *(char *)((long)local_2e8 + 0x14) = 'U';
    *(char *)((long)local_2e8 + 0x15) = 'T';
    local_2e0 = (_func_int **)local_378._0_8_;
    *(char *)((long)local_2e8 + local_378._0_8_) = '\0';
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_2e8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,(ulong)pcVar24);
    format_00 = extraout_RDX;
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
      format_00 = extraout_RDX_00;
    }
    NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
              ((string *)local_2e8,(_anonymous_namespace_ *)local_310,format_00);
    aStack_362._M_allocated_capacity._2_5_ = 0x54414d524f;
    local_368[0] = 'L';
    local_368[1] = 'A';
    local_368[2] = 'Y';
    local_368[3] = 'O';
    local_368[4] = 'U';
    local_368[5] = 'T';
    aStack_362._M_allocated_capacity._0_2_ = 0x465f;
    local_378._8_8_ = 0xd;
    aStack_362._M_local_buf[7] = '\0';
    local_378._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_368;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
    memory_00 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
      memory_00 = extraout_EDX_00;
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
      memory_00 = extraout_EDX_01;
    }
    NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
              ((string *)local_2e8,(_anonymous_namespace_ *)(ulong)local_334,memory_00);
    local_308._M_dataplus._M_p = &DAT_00000010;
    local_378._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_368;
    local_378._0_8_ = std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_308);
    local_368[0] = SUB81(local_308._M_dataplus._M_p,0);
    local_368[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
    local_368[2] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x10);
    local_368[3] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x18);
    local_368[4] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x20);
    local_368[5] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x28);
    aStack_362._M_allocated_capacity._0_2_ = (undefined2)((ulong)local_308._M_dataplus._M_p >> 0x30)
    ;
    builtin_strncpy((char *)local_378._0_8_,"MEMORY_QUALIFIER",0x10);
    local_378._8_8_ = local_308._M_dataplus._M_p;
    *(char *)(local_378._0_8_ + (long)local_308._M_dataplus._M_p) = '\0';
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
    uVar12 = (ulong)local_310->type;
    if (uVar12 < 0x24) {
      if ((0xc00000009U >> (uVar12 & 0x3f) & 1) == 0) {
        lVar18 = 1;
        if ((0x38000000UL >> (uVar12 & 0x3f) & 1) == 0) {
          if ((0x2c0000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_015e77eb;
          pbVar21 = (bool *)0x1ad5cd4;
        }
        else {
          pbVar21 = (bool *)0x1c42e41;
        }
      }
      else {
        pbVar21 = glcts::fixed_sample_locations_values + 1;
        lVar18 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pbVar21,lVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"image",5);
      if (7 < uVar19 || (local_349 & 1) != 0) goto LAB_015e77eb;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,&DAT_01c79d68 + *(int *)(&DAT_01c79d68 + local_168),
                 *(long *)(&DAT_01c79d88 + local_160 * 8));
      std::__cxx11::stringbuf::str();
    }
    else {
LAB_015e77eb:
      local_378._8_8_ = (pointer)0x0;
      local_368[0] = '\0';
      local_378._0_8_ = local_368;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
    std::ios_base::~ios_base(local_278);
    local_2d8[0]._M_local_buf[0] = 'I';
    local_2d8[0]._M_allocated_capacity._1_5_ = 0x5f4547414d;
    local_2d8[0]._M_local_buf[6] = 'T';
    local_2d8[0]._M_local_buf[7] = 'Y';
    local_2d8[0]._8_2_ = 0x4550;
    local_2e0 = (_func_int **)0xa;
    local_2d8[0]._10_4_ = local_2d8[0]._10_4_ & 0xffffff00;
    local_2e8 = (undefined1  [8])local_2d8;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_2e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_378);
    function_00 = extraout_EDX_02;
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
      function_00 = extraout_EDX_03;
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
      function_00 = extraout_EDX_04;
    }
    NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
              ((string *)local_2e8,local_348,function_00);
    aStack_362._M_allocated_capacity._2_5_ = 0x454d414e5f;
    local_368[0] = 'F';
    local_368[1] = 'U';
    local_368[2] = 'N';
    local_368[3] = 'C';
    local_368[4] = 'T';
    local_368[5] = 'I';
    aStack_362._M_allocated_capacity._0_2_ = 0x4e4f;
    local_378._8_8_ = 0xd;
    aStack_362._M_local_buf[7] = '\0';
    local_378._0_8_ = local_368;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    p_Var5 = local_348;
    if (uVar19 - 1 < 4) {
      local_2d8[0]._8_2_ = 0x3120;
      local_2d8[0]._10_4_ = 0x2931202c;
      local_2d8[0]._M_local_buf[0] = 'i';
      local_2d8[0]._M_allocated_capacity._1_5_ = 0x2833636576;
      local_2d8[0]._M_local_buf[6] = '1';
      local_2d8[0]._M_local_buf[7] = ',';
      local_2e0 = (_func_int **)0xe;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2d8[0]._M_local_buf + 0xe);
    }
    else if (uVar19 == 7) {
      local_2d8[0]._M_local_buf[0] = '1';
      local_2e0 = (_func_int **)&DAT_00000001;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2d8[0]._M_local_buf + 1);
    }
    else if (uVar19 == 0) {
      local_2d8[0]._M_local_buf[0] = 'i';
      local_2d8[0]._M_allocated_capacity._1_5_ = 0x2832636576;
      local_2d8[0]._M_local_buf[6] = '1';
      local_2d8[0]._M_local_buf[7] = ',';
      local_2d8[0]._8_2_ = 0x3120;
      local_2d8[0]._10_1_ = 0x29;
      local_2e0 = (_func_int **)0xb;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2d8[0]._M_local_buf + 0xb);
    }
    else {
      paVar17 = local_2d8;
      local_2e0 = (_func_int **)0x0;
    }
    local_2e8 = (undefined1  [8])local_2d8;
    paVar17->_M_local_buf[0] = '\0';
    aStack_362._M_allocated_capacity._2_5_ = 0x505f4d4152;
    local_368[0] = 'I';
    local_368[1] = 'M';
    local_368[2] = 'A';
    local_368[3] = 'G';
    local_368[4] = 'E';
    local_368[5] = '_';
    aStack_362._M_allocated_capacity._0_2_ = 0x4150;
    local_378._8_8_ = 0xd;
    aStack_362._M_local_buf[7] = '\0';
    local_378._0_8_ = local_368;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,", ",2);
    uVar12 = (ulong)local_310->type;
    if (0x23 < uVar12) {
switchD_015e7b33_caseD_1:
      local_378._8_8_ = 0;
      pcVar24 = local_368;
      goto LAB_015e7bb8;
    }
    if ((0xc00000009U >> (uVar12 & 0x3f) & 1) == 0) {
      pcVar24 = "i";
      if ((0x38000000UL >> (uVar12 & 0x3f) & 1) == 0) {
        if ((0x2c0000000U >> (uVar12 & 0x3f) & 1) == 0) goto switchD_015e7b33_caseD_1;
        pcVar24 = "u";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar24,1);
      pcVar24 = ", 1";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,glcts::fixed_sample_locations_values + 1,0);
      pcVar24 = ", 1.0";
    }
    switch((ulong)p_Var5 & 0xffffffff) {
    case 0:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,"vec4(1, 1, 1, 1)",0x10);
      std::__cxx11::stringbuf::str();
      break;
    default:
      goto switchD_015e7b33_caseD_1;
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
      local_368[2] = '1';
      local_368[0] = ',';
      local_368[1] = ' ';
      local_378._8_8_ = 3;
      pcVar24 = local_368 + 3;
      goto LAB_015e7bb8;
    case 8:
      local_378._0_8_ = local_368;
      sVar14 = strlen(pcVar24);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,pcVar24,pcVar24 + sVar14);
      break;
    case 9:
      local_368[4] = ' ';
      local_368[5] = '1';
      local_368[0] = ',';
      local_368[1] = ' ';
      local_368[2] = '1';
      local_368[3] = ',';
      local_378._8_8_ = 6;
      pcVar24 = local_368 + 6;
LAB_015e7bb8:
      *pcVar24 = '\0';
      local_378._0_8_ = local_368;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
    std::ios_base::~ios_base(local_278);
    local_2e8 = (undefined1  [8])local_2d8;
    local_308._M_dataplus._M_p = (pointer)0x12;
    local_2e8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)&local_308);
    local_2d8[0]._M_local_buf[0] = SUB81(local_308._M_dataplus._M_p,0);
    local_2d8[0]._M_allocated_capacity._1_5_ = (undefined5)((ulong)local_308._M_dataplus._M_p >> 8);
    local_2d8[0]._M_local_buf[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
    local_2d8[0]._M_local_buf[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_2e8 = 0x4e4f4954434e5546;
    *(char *)((long)local_2e8 + 8) = '_';
    *(char *)((long)local_2e8 + 9) = 'A';
    *(char *)((long)local_2e8 + 10) = 'R';
    *(char *)((long)local_2e8 + 0xb) = 'G';
    *(char *)((long)local_2e8 + 0xc) = 'U';
    *(char *)((long)local_2e8 + 0xd) = 'M';
    *(char *)((long)local_2e8 + 0xe) = 'E';
    *(char *)((long)local_2e8 + 0xf) = 'N';
    *(char *)((long)local_2e8 + 0x10) = 'T';
    *(char *)((long)local_2e8 + 0x11) = 'S';
    local_2e0 = (_func_int **)local_308._M_dataplus._M_p;
    *(char *)((long)local_2e8 + (long)local_308._M_dataplus._M_p) = '\0';
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_2e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_378);
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,
                      CONCAT17(local_2d8[0]._M_local_buf[7],
                               CONCAT16(local_2d8[0]._M_local_buf[6],
                                        CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                 local_2d8[0]._M_local_buf[0]))) + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    local_378._0_8_ = local_368;
    local_308._M_dataplus._M_p = (pointer)0x115;
    pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_308);
    _Var6._M_p = local_308._M_dataplus._M_p;
    local_368[0] = SUB81(local_308._M_dataplus._M_p,0);
    local_368[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
    local_368[2] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x10);
    local_368[3] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x18);
    local_368[4] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x20);
    local_368[5] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x28);
    aStack_362._M_allocated_capacity._0_2_ = (undefined2)((ulong)local_308._M_dataplus._M_p >> 0x30)
    ;
    local_378._0_8_ = pcVar13;
    memcpy(pcVar13,
           "${GLSL_VERSION_DECL}\n${GLSL_TYPE_EXTENSION}\n${GLSL_FUNCTION_EXTENSION}\n${GEOMETRY_SHADER_LAYOUT}\nlayout(${LAYOUT_FORMAT}, binding = 0) highp uniform ${MEMORY_QUALIFIER} ${IMAGE_TYPE} u_img0;\nvoid main(void)\n{\n ${FUNCTION_NAME}(u_img0, ${IMAGE_PARAM_P}${FUNCTION_ARGUMENTS});\n}\n"
           ,0x115);
    local_378._8_8_ = _Var6._M_p;
    pcVar13[_Var6._M_p] = '\0';
    tcu::StringTemplate::StringTemplate((StringTemplate *)local_2e8,(string *)local_378);
    tcu::StringTemplate::specialize
              (&local_330,(StringTemplate *)local_2e8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_100);
    uVar12 = local_148;
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_2e8);
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,
                      CONCAT26(aStack_362._M_allocated_capacity._0_2_,
                               CONCAT15(local_368[5],
                                        CONCAT14(local_368[4],
                                                 CONCAT13(local_368[3],
                                                          CONCAT12(local_368[2],
                                                                   CONCAT11(local_368[1],
                                                                            local_368[0])))))) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_100);
    renderCtx = local_340->m_renderCtx;
    memset((MessageBuilder *)local_2e8,0,0xac);
    local_238._0_8_ = (pointer)0x0;
    local_238[8] = 0;
    local_238._9_7_ = 0;
    local_238[0x10] = 0;
    local_238._17_8_ = 0;
    local_378._0_4_ = (int)uVar12;
    local_378._8_8_ = local_368 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_378 + 8),local_330._M_dataplus._M_p,
               local_330._M_dataplus._M_p + local_330._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e8 + (local_378._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_378 + 8)
               );
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_2e8);
    if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
      operator_delete((void *)local_378._8_8_,
                      CONCAT26(aStack_362._8_2_,
                               CONCAT15(aStack_362._M_local_buf[7],
                                        aStack_362._M_allocated_capacity._2_5_)) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_258);
    lVar18 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e8 + lVar18));
      lVar18 = lVar18 + -0x18;
    } while (lVar18 != -0x18);
    if (*(char *)(**(long **)(local_100 + uVar12 * 0x18) + 0x58) == '\x01') {
      glu::operator<<(local_158,(ShaderProgram *)local_100);
      local_2e8 = (undefined1  [8])local_158;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2e0,"Expected program to fail, but compilation passed.",0x31);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
      std::ios_base::~ios_base(local_270);
      local_2e8 = (undefined1  [8])local_2d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2e8,"Shader was not expected to compile.","");
      NegativeTestContext::fail(local_340,(string *)local_2e8);
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT51(local_2d8[0]._M_allocated_capacity._1_5_,
                                                   local_2d8[0]._M_local_buf[0]))) + 1);
      }
    }
    NegativeTestContext::endSection(local_340);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
LAB_015e7f2b:
    lVar20 = lVar20 + 1;
    if (lVar20 == 6) {
      NegativeTestContext::endSection(local_340);
      return;
    }
  } while( true );
}

Assistant:

void testShader (NegativeTestContext& ctx, ImageOperation function, MemoryQualifier memory, glu::TextureTestUtil::TextureType imageType, const tcu::TextureFormat& format)
{
	tcu::TestLog& log = ctx.getLog();
	ctx.beginSection(getFunctionName(function) + " " + getMemoryQualifier(memory) + " " + getShaderImageLayoutQualifier(format));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			std::string					shaderSource(generateShaderSource(function, memory, imageType, format, s_shaders[ndx]));
			const glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], shaderSource));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}